

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

int safe_var_substitution_p(gen_ctx_t gen_ctx,MIR_reg_t var,bb_insn_t_conflict bb_insn)

{
  combine_ctx *pcVar1;
  uint uVar2;
  int iVar3;
  dead_var_t_conflict dv;
  dead_var_t_conflict pdVar4;
  undefined4 in_register_00000034;
  size_t def_insn_num;
  ulong uVar5;
  char in_stack_00000008;
  MIR_reg_t in_stack_00000010;
  MIR_reg_t in_stack_00000020;
  MIR_reg_t in_stack_00000024;
  
  def_insn_num = CONCAT44(in_register_00000034,var);
  if (var != 0xffffffff) {
    pcVar1 = gen_ctx->combine_ctx;
    if (pcVar1->var_ref_ages == (VARR_size_t *)0x0) {
      safe_var_substitution_p_cold_1();
      if (in_stack_00000008 == '\v') {
        if ((in_stack_00000020 != 0xffffffff) &&
           (iVar3 = obsolete_var_p((gen_ctx_t)gen_ctx->combine_ctx,in_stack_00000020,def_insn_num),
           iVar3 != 0)) {
          return 1;
        }
        if ((in_stack_00000024 != 0xffffffff) &&
           (iVar3 = obsolete_var_p((gen_ctx_t)gen_ctx->combine_ctx,in_stack_00000024,def_insn_num),
           iVar3 != 0)) {
          return 1;
        }
        uVar2 = (uint)(def_insn_num < gen_ctx->combine_ctx->last_mem_ref_insn_num);
      }
      else {
        uVar2 = 0;
        if (in_stack_00000008 == '\x02') {
          iVar3 = obsolete_var_p((gen_ctx_t)gen_ctx->combine_ctx,in_stack_00000010,def_insn_num);
          return iVar3;
        }
      }
      return uVar2;
    }
    uVar5 = (ulong)var;
    if (((uVar5 < pcVar1->var_ref_ages->els_num) &&
        (pcVar1->var_ref_ages_addr[uVar5] == pcVar1->curr_bb_var_ref_age)) &&
       (pcVar1->var_refs_addr[uVar5].def_p != '\0')) {
      for (pdVar4 = (bb_insn->insn_dead_vars).head; pdVar4 != (dead_var_t_conflict)0x0;
          pdVar4 = (pdVar4->dead_var_link).next) {
        if (pdVar4->var == var) {
          return 1;
        }
      }
    }
  }
  return 0;
}

Assistant:

static int safe_var_substitution_p (gen_ctx_t gen_ctx, MIR_reg_t var, bb_insn_t bb_insn) {
  return (var != MIR_NON_VAR && var < VARR_LENGTH (size_t, var_ref_ages)
          && var_ref_ages_addr[var] == curr_bb_var_ref_age
          && var_refs_addr[var].def_p
          /* It is not safe to substitute if there is another use after def insn before
             the current insn as we delete def insn after the substitution. */
          && find_bb_insn_dead_var (bb_insn, var) != NULL);
}